

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

ctmbstr prvTidyGetEncodingOptNameFromTidyId(uint id)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x18 == 0x168) {
      return (ctmbstr)0x0;
    }
    lVar1 = lVar2 + 0x18;
  } while (*(uint *)((long)&enc2iana[0].id + lVar2) != id);
  return *(ctmbstr *)((long)&enc2iana[0].tidyOptName + lVar2);
}

Assistant:

ctmbstr TY_(GetEncodingOptNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].tidyOptName;

    return NULL;
}